

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj2pbrt.cpp
# Opt level: O1

bool tinyobj::exportFaceGroupToShape
               (shape_t *shape,
               map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
               *vertexCache,vector<float,_std::allocator<float>_> *in_positions,
               vector<float,_std::allocator<float>_> *in_normals,
               vector<float,_std::allocator<float>_> *in_texcoords,
               vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
               *faceGroup,vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *tags,
               int material_id,string *name,bool clearCache,uint flags,string *err)

{
  mesh_t *positions;
  vector<float,_std::allocator<float>_> *normals;
  vector<float,_std::allocator<float>_> *texcoords;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  vector<int,_std::allocator<int>_> *this_00;
  undefined8 uVar1;
  pointer pvVar2;
  pointer pvVar3;
  iterator iVar4;
  iterator iVar5;
  pointer puVar6;
  pointer puVar7;
  pointer pfVar8;
  pointer paVar9;
  bool bVar10;
  pointer paVar11;
  pointer paVar12;
  pointer paVar13;
  string *psVar14;
  pointer pvVar15;
  ostream *poVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined3 in_stack_00000021;
  undefined4 in_stack_0000002c;
  uchar local_295;
  uint v;
  uint v2;
  uint v1;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_288;
  vertex_index i2;
  vertex_index i1;
  long local_208 [2];
  undefined1 local_1f8 [16];
  pointer local_1e8;
  pointer local_1e0;
  vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  *local_1d8;
  ulong local_1d0;
  long local_1c8;
  long local_1c0;
  vertex_index i0;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f8._8_8_ = local_1f8._0_8_;
  local_1f8._0_8_ = in_texcoords;
  local_1e0 = (faceGroup->
              super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_1e8 = (faceGroup->
              super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (local_1e0 != local_1e8) {
    pvVar15 = (faceGroup->
              super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((faceGroup->
        super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pvVar15) {
      positions = &shape->mesh;
      normals = &(shape->mesh).normals;
      texcoords = &(shape->mesh).texcoords;
      local_288 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&(shape->mesh).indices;
      this = &(shape->mesh).num_vertices;
      this_00 = &(shape->mesh).material_ids;
      uVar18 = 0;
      local_1d8 = faceGroup;
      do {
        pvVar15 = pvVar15 + uVar18;
        pvVar2 = (pvVar15->
                 super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        i0.vn_idx = pvVar2->vn_idx;
        i0.v_idx = pvVar2->v_idx;
        i0.vt_idx = pvVar2->vt_idx;
        i1.v_idx = -1;
        i1.vt_idx = -1;
        i1.vn_idx = -1;
        pvVar2 = (pvVar15->
                 super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        i2.vn_idx = pvVar2[1].vn_idx;
        i2.v_idx = pvVar2[1].v_idx;
        i2.vt_idx = pvVar2[1].vt_idx;
        pvVar2 = (pvVar15->
                 super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pvVar3 = (pvVar15->
                 super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        uVar20 = ((long)pvVar3 - (long)pvVar2 >> 2) * -0x5555555555555555;
        local_1d0 = uVar18;
        if ((_clearCache & 1) == 0) {
          if (pvVar3 != pvVar2) {
            lVar19 = uVar20 + (uVar20 == 0);
            lVar21 = 0;
            do {
              v = updateVertex(vertexCache,&positions->positions,normals,texcoords,in_positions,
                               in_normals,(vector<float,_std::allocator<float>_> *)local_1f8._0_8_,
                               (vertex_index *)
                               ((long)&((pvVar15->
                                        super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->v_idx + lVar21)
                              );
              iVar4._M_current =
                   (shape->mesh).indices.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (shape->mesh).indices.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>(local_288,iVar4,&v);
              }
              else {
                *iVar4._M_current = v;
                (shape->mesh).indices.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar4._M_current + 1;
              }
              lVar21 = lVar21 + 0xc;
              lVar19 = lVar19 + -1;
            } while (lVar19 != 0);
          }
          v = CONCAT31(v._1_3_,(char)uVar20);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (this,(uchar *)&v);
          iVar5._M_current =
               (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)this_00,iVar5,&material_id);
          }
          else {
            *iVar5._M_current = material_id;
            (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
        }
        else if (2 < uVar20) {
          lVar19 = uVar20 - 2;
          lVar21 = 0x18;
          do {
            i1.vn_idx = i2.vn_idx;
            i1.v_idx = i2.v_idx;
            i1.vt_idx = i2.vt_idx;
            pvVar2 = (pvVar15->
                     super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            i2._0_8_ = *(undefined8 *)((long)&pvVar2->v_idx + lVar21);
            i2.vn_idx = *(int *)((long)&pvVar2->vn_idx + lVar21);
            uVar1 = local_1f8._0_8_;
            local_1c8 = lVar21;
            local_1c0 = lVar19;
            v = updateVertex(vertexCache,&positions->positions,normals,texcoords,in_positions,
                             in_normals,(vector<float,_std::allocator<float>_> *)local_1f8._0_8_,&i0
                            );
            v1 = updateVertex(vertexCache,&positions->positions,normals,texcoords,in_positions,
                              in_normals,(vector<float,_std::allocator<float>_> *)uVar1,&i1);
            v2 = updateVertex(vertexCache,&positions->positions,normals,texcoords,in_positions,
                              in_normals,(vector<float,_std::allocator<float>_> *)uVar1,&i2);
            iVar4._M_current =
                 (shape->mesh).indices.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (shape->mesh).indices.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(local_288,iVar4,&v);
            }
            else {
              *iVar4._M_current = v;
              (shape->mesh).indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            }
            lVar19 = local_1c0;
            iVar4._M_current =
                 (shape->mesh).indices.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (shape->mesh).indices.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(local_288,iVar4,&v1);
            }
            else {
              *iVar4._M_current = v1;
              (shape->mesh).indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            }
            iVar4._M_current =
                 (shape->mesh).indices.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (shape->mesh).indices.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(local_288,iVar4,&v2);
            }
            else {
              *iVar4._M_current = v2;
              (shape->mesh).indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            }
            local_295 = '\x03';
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (this,&local_295);
            iVar5._M_current =
                 (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)this_00,iVar5,&material_id);
            }
            else {
              *iVar5._M_current = material_id;
              (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar5._M_current + 1;
            }
            lVar21 = local_1c8 + 0xc;
            lVar19 = lVar19 + -1;
          } while (lVar19 != 0);
        }
        uVar18 = local_1d0 + 1;
        pvVar15 = (local_1d8->
                  super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar18 < (ulong)(((long)(local_1d8->
                                       super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar15
                                >> 3) * -0x5555555555555555));
    }
    psVar14 = name;
    if (((_clearCache & 2) != 0) &&
       ((shape->mesh).normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (shape->mesh).normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      puVar6 = (shape->mesh).indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar7 = (shape->mesh).indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar18 = (long)puVar7 - (long)puVar6 >> 2;
      if (uVar18 * -0x5555555555555555 < 0x5555555555555556) {
        std::vector<float,_std::allocator<float>_>::resize
                  (&(shape->mesh).normals,
                   (long)(shape->mesh).positions.super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(shape->mesh).positions.super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2);
        if (puVar7 != puVar6) {
          uVar20 = 0;
          auVar30 = ZEXT1664(_DAT_00112030);
          do {
            pfVar8 = (shape->mesh).positions.super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            puVar6 = (shape->mesh).indices.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar17 = (ulong)(puVar6[uVar20 + 2] * 3);
            auVar23._8_8_ = 0;
            auVar23._0_8_ = *(ulong *)(pfVar8 + (ulong)(puVar6[uVar20] * 3) + 1);
            auVar28._8_8_ = 0;
            auVar28._0_8_ = *(ulong *)(pfVar8 + (ulong)(puVar6[uVar20 + 1] * 3) + 1);
            auVar28 = vsubps_avx(auVar28,auVar23);
            auVar25 = vinsertps_avx(ZEXT416((uint)pfVar8[uVar17 + 2]),ZEXT416((uint)pfVar8[uVar17]),
                                    0x10);
            auVar23 = vpermt2ps_avx512vl(auVar23,auVar30._0_16_,
                                         ZEXT416((uint)pfVar8[puVar6[uVar20] * 3]));
            auVar25 = vsubps_avx(auVar25,auVar23);
            auVar26 = ZEXT416((uint)(pfVar8[puVar6[uVar20 + 1] * 3] - pfVar8[puVar6[uVar20] * 3]));
            auVar23 = vpermt2ps_avx512vl(auVar28,auVar30._0_16_,auVar26);
            auVar27 = ZEXT416((uint)(pfVar8[uVar17 + 1] -
                                    (float)*(ulong *)(pfVar8 + (ulong)(puVar6[uVar20] * 3) + 1)));
            auVar24 = vpermt2ps_avx512vl(auVar25,SUB6416(ZEXT464(4),0),auVar27);
            auVar29._0_4_ = auVar24._0_4_ * auVar23._0_4_;
            auVar29._4_4_ = auVar24._4_4_ * auVar23._4_4_;
            auVar29._8_4_ = auVar24._8_4_ * auVar23._8_4_;
            auVar29._12_4_ = auVar24._12_4_ * auVar23._12_4_;
            auVar23 = vfmsub231ps_fma(auVar29,auVar28,auVar25);
            auVar25 = vmovshdup_avx(auVar25);
            auVar28 = vfmsub231ss_fma(ZEXT416((uint)(auVar25._0_4_ * auVar28._0_4_)),auVar26,auVar27
                                     );
            auVar25._0_4_ = auVar23._0_4_ * auVar23._0_4_;
            auVar25._4_4_ = auVar23._4_4_ * auVar23._4_4_;
            auVar25._8_4_ = auVar23._8_4_ * auVar23._8_4_;
            auVar25._12_4_ = auVar23._12_4_ * auVar23._12_4_;
            auVar25 = vmovshdup_avx(auVar25);
            auVar25 = vfmadd231ss_fma(auVar25,auVar23,auVar23);
            auVar25 = vfmadd231ss_fma(auVar25,auVar28,auVar28);
            if (auVar25._0_4_ < 0.0) {
              local_1f8 = auVar23;
              fVar22 = sqrtf(auVar25._0_4_);
              auVar30 = ZEXT1664(_DAT_00112030);
              auVar23 = local_1f8;
            }
            else {
              auVar25 = vsqrtss_avx(auVar25,auVar25);
              fVar22 = auVar25._0_4_;
            }
            bVar10 = fVar22 != 1.0;
            auVar24._4_4_ = fVar22;
            auVar24._0_4_ = fVar22;
            auVar24._8_4_ = fVar22;
            auVar24._12_4_ = fVar22;
            auVar25 = vdivps_avx(auVar23,auVar24);
            if ((!bVar10) && (!NAN(fVar22))) {
              auVar25 = auVar23;
            }
            fVar22 = (float)((uint)bVar10 * (int)(auVar28._0_4_ / fVar22) +
                            (uint)!bVar10 * (int)auVar28._0_4_);
            pfVar8 = (shape->mesh).normals.super__Vector_base<float,_std::allocator<float>_>._M_impl
                     .super__Vector_impl_data._M_start;
            uVar17 = (ulong)((shape->mesh).indices.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar20] * 3);
            uVar1 = vmovlps_avx(auVar25);
            *(undefined8 *)(pfVar8 + uVar17) = uVar1;
            pfVar8[uVar17 + 2] = fVar22;
            uVar17 = (ulong)((shape->mesh).indices.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar20 + 1] * 3);
            pfVar8 = (shape->mesh).normals.super__Vector_base<float,_std::allocator<float>_>._M_impl
                     .super__Vector_impl_data._M_start;
            uVar1 = vmovlps_avx(auVar25);
            *(undefined8 *)(pfVar8 + uVar17) = uVar1;
            pfVar8[uVar17 + 2] = fVar22;
            pfVar8 = (shape->mesh).normals.super__Vector_base<float,_std::allocator<float>_>._M_impl
                     .super__Vector_impl_data._M_start;
            uVar17 = (ulong)((shape->mesh).indices.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar20 + 2] * 3);
            uVar1 = vmovlps_avx(auVar25);
            *(undefined8 *)(pfVar8 + uVar17) = uVar1;
            pfVar8[uVar17 + 2] = fVar22;
            uVar20 = uVar20 + 3;
          } while (uVar20 < uVar18);
        }
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)&i0);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"WARN: The shape ",0x10);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,(psVar14->_M_dataplus)._M_p,psVar14->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,
                   " does not have a topology of triangles, therfore the normals calculation could not be performed. Select the tinyobj::triangulation flag for this object."
                   ,0x98);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
        std::ostream::put((char)poVar16);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)CONCAT44(in_stack_0000002c,flags),i1._0_8_);
        if ((long *)i1._0_8_ != local_208) {
          operator_delete((void *)i1._0_8_,local_208[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&i0);
        std::ios_base::~ios_base(local_138);
      }
    }
    std::__cxx11::string::_M_assign((string *)shape);
    paVar9 = (shape->mesh).tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    paVar11 = (tags->super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    paVar12 = (shape->mesh).tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>
              ._M_impl.super__Vector_impl_data._M_start;
    paVar13 = (shape->mesh).tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    (shape->mesh).tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
    super__Vector_impl_data._M_start =
         (tags->super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>)._M_impl.
         super__Vector_impl_data._M_start;
    (shape->mesh).tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
    super__Vector_impl_data._M_finish = paVar11;
    (shape->mesh).tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (tags->super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>)._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (tags->super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>)._M_impl.
    super__Vector_impl_data._M_start = paVar12;
    (tags->super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>)._M_impl.
    super__Vector_impl_data._M_finish = paVar13;
    (tags->super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = paVar9;
    std::
    _Rb_tree<tinyobj::vertex_index,_std::pair<const_tinyobj::vertex_index,_unsigned_int>,_std::_Select1st<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
    ::clear(&vertexCache->_M_t);
  }
  return local_1e0 != local_1e8;
}

Assistant:

static bool exportFaceGroupToShape(
    shape_t &shape, std::map<vertex_index, unsigned int> vertexCache,
    const std::vector<float> &in_positions,
    const std::vector<float> &in_normals,
    const std::vector<float> &in_texcoords,
    const std::vector<std::vector<vertex_index> > &faceGroup,
    std::vector<tag_t> &tags, const int material_id, const std::string &name,
    bool clearCache, unsigned int flags, std::string& err ) {
  if (faceGroup.empty()) {
    return false;
  }

  bool triangulate( ( flags & triangulation ) == triangulation );
  bool normals_calculation( ( flags & calculate_normals ) == calculate_normals );

  // Flatten vertices and indices
  for (size_t i = 0; i < faceGroup.size(); i++) {
    const std::vector<vertex_index> &face = faceGroup[i];

    vertex_index i0 = face[0];
    vertex_index i1(-1);
    vertex_index i2 = face[1];

    size_t npolys = face.size();

    if (triangulate) {

      // Polygon -> triangle fan conversion
      for (size_t k = 2; k < npolys; k++) {
        i1 = i2;
        i2 = face[k];

        unsigned int v0 = updateVertex(
            vertexCache, shape.mesh.positions, shape.mesh.normals,
            shape.mesh.texcoords, in_positions, in_normals, in_texcoords, i0);
        unsigned int v1 = updateVertex(
            vertexCache, shape.mesh.positions, shape.mesh.normals,
            shape.mesh.texcoords, in_positions, in_normals, in_texcoords, i1);
        unsigned int v2 = updateVertex(
            vertexCache, shape.mesh.positions, shape.mesh.normals,
            shape.mesh.texcoords, in_positions, in_normals, in_texcoords, i2);

        shape.mesh.indices.push_back(v0);
        shape.mesh.indices.push_back(v1);
        shape.mesh.indices.push_back(v2);

        shape.mesh.num_vertices.push_back(3);
        shape.mesh.material_ids.push_back(material_id);
      }
    } else {

      for (size_t k = 0; k < npolys; k++) {
        unsigned int v =
            updateVertex(vertexCache, shape.mesh.positions, shape.mesh.normals,
                         shape.mesh.texcoords, in_positions, in_normals,
                         in_texcoords, face[k]);

        shape.mesh.indices.push_back(v);
      }

      shape.mesh.num_vertices.push_back(static_cast<unsigned char>(npolys));
      shape.mesh.material_ids.push_back(material_id); // per face
    }
  }

  if (normals_calculation && shape.mesh.normals.empty()) {
	  const size_t nIndexs = shape.mesh.indices.size();
	  if (nIndexs % 3 == 0) {
		  shape.mesh.normals.resize(shape.mesh.positions.size());
		  for (size_t iIndices = 0; iIndices < nIndexs; iIndices += 3) {
			  float3 v1, v2, v3;
			  memcpy(&v1, &shape.mesh.positions[shape.mesh.indices[iIndices] * 3], sizeof(float3));
			  memcpy(&v2, &shape.mesh.positions[shape.mesh.indices[iIndices + 1] * 3], sizeof(float3));
			  memcpy(&v3, &shape.mesh.positions[shape.mesh.indices[iIndices + 2] * 3], sizeof(float3));

			  float3 v12(v1, v2);
			  float3 v13(v1, v3);

			  float3 normal = v12.crossproduct(v13);
			  normal.normalize();

			  memcpy(&shape.mesh.normals[shape.mesh.indices[iIndices] * 3], &normal, sizeof(float3));
			  memcpy(&shape.mesh.normals[shape.mesh.indices[iIndices + 1] * 3], &normal, sizeof(float3));
			  memcpy(&shape.mesh.normals[shape.mesh.indices[iIndices + 2] * 3], &normal, sizeof(float3));
		  }
	  } else {

		  std::stringstream ss;
		  ss << "WARN: The shape " << name << " does not have a topology of triangles, therfore the normals calculation could not be performed. Select the tinyobj::triangulation flag for this object." << std::endl;
		  err += ss.str();
	  }
  }

  shape.name = name;
  shape.mesh.tags.swap(tags);

  if (clearCache)
    vertexCache.clear();

  return true;
}